

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsXMLReader.cxx
# Opt level: O0

bool __thiscall kws::XMLReader::Open(XMLReader *this,char *filename)

{
  ulong uVar1;
  char *pcVar2;
  _Ios_Openmode in_ESI;
  char *in_RDI;
  char *buf;
  unsigned_long fileSize;
  fpos local_30 [16];
  long local_20;
  bool local_1;
  
  std::ifstream::open(in_RDI,in_ESI);
  uVar1 = std::ios::fail();
  if ((uVar1 & 1) == 0) {
    std::istream::seekg((long)in_RDI,_S_beg);
    local_30 = (fpos  [16])std::istream::tellg();
    local_20 = std::fpos::operator_cast_to_long(local_30);
    std::istream::seekg((long)in_RDI,_S_beg);
    pcVar2 = (char *)operator_new__(local_20 + 1);
    std::istream::read(in_RDI,(long)pcVar2);
    pcVar2[local_20] = '\0';
    std::__cxx11::string::operator=((string *)(in_RDI + 0x248),pcVar2);
    std::__cxx11::string::resize((ulong)(in_RDI + 0x248));
    if (pcVar2 != (char *)0x0) {
      operator_delete__(pcVar2);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool XMLReader::Open(const char* filename)
{
  // Open file for reading
  m_File.open(filename,std::ifstream::binary);
  if ( m_File.fail() )
    {
    return false;
    }

  m_File.seekg(0,std::ios::end);
  unsigned long fileSize = static_cast<unsigned long>(m_File.tellg());
  m_File.seekg(0,std::ios::beg);

  char* buf = new char[fileSize+1];
  m_File.read(buf,fileSize);
  buf[fileSize] = 0;
  m_Buffer = buf;
  m_Buffer.resize(fileSize);
  delete [] buf;

  return true;
}